

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O0

void test_bson_as_json_spacing(void)

{
  int iVar1;
  char *pcVar2;
  char *str;
  size_t len;
  bson_t d;
  long local_188;
  undefined4 local_180;
  undefined4 local_17c;
  undefined1 local_178;
  
  memset(&local_180,0,0x80);
  local_180 = 3;
  local_17c = 5;
  local_178 = 5;
  pcVar2 = (char *)bson_as_json(&local_180,&local_188);
  iVar1 = strcmp(pcVar2,"{ }");
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0xa7f,"test_bson_as_json_spacing","0 == strcmp (str, \"{ }\")");
    abort();
  }
  if (local_188 != 3) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0xa80,"test_bson_as_json_spacing","len == 3");
    abort();
  }
  bson_free(pcVar2);
  bson_append_int32(&local_180,"a",1);
  pcVar2 = (char *)bson_as_json(&local_180,&local_188);
  iVar1 = strcmp(pcVar2,"{ \"a\" : 1 }");
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0xa85,"test_bson_as_json_spacing","0 == strcmp (str, \"{ \\\"a\\\" : 1 }\")");
    abort();
  }
  if (local_188 != 0xb) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0xa86,"test_bson_as_json_spacing","len == 11");
    abort();
  }
  bson_free(pcVar2);
  bson_destroy(&local_180);
  return;
}

Assistant:

static void
test_bson_as_json_spacing (void)
{
   bson_t d = BSON_INITIALIZER;
   size_t len;
   char *str;

   str = bson_as_json (&d, &len);
   BSON_ASSERT (0 == strcmp (str, "{ }"));
   BSON_ASSERT (len == 3);
   bson_free (str);

   BSON_APPEND_INT32 (&d, "a", 1);
   str = bson_as_json (&d, &len);
   BSON_ASSERT (0 == strcmp (str, "{ \"a\" : 1 }"));
   BSON_ASSERT (len == 11);
   bson_free (str);

   bson_destroy (&d);
}